

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTypePtr
xmlSchemaParseExtension
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,
          xmlSchemaTypeType parentType)

{
  xmlChar **uri;
  _xmlAttr *p_Var1;
  xmlSchemaTypeType type;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  xmlSchemaTypePtr extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  xmlSchemaAnnotPtr annot;
  xmlSchemaTypePtr pxVar4;
  undefined4 extraout_var_02;
  xmlSchemaTypePtr pxVar5;
  xmlSchemaTypePtr extraout_RAX_00;
  undefined4 in_register_0000000c;
  xmlAttrPtr attr;
  xmlNodePtr pxVar6;
  xmlNs *pxVar7;
  xmlNodePtr extraout_RDX;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr extraout_RDX_01;
  xmlNodePtr extraout_RDX_02;
  xmlChar **name;
  xmlChar **message;
  char *message_00;
  _xmlAttr **pp_Var8;
  bool bVar9;
  char *in_stack_00000008;
  xmlChar **in_stack_ffffffffffffffa8;
  xmlNodePtr local_48;
  xmlSchemaTypeType local_3c;
  xmlSchemaTypePtr local_38;
  
  attr = (xmlAttrPtr)CONCAT44(in_register_0000000c,parentType);
  local_38 = ctxt->ctxtType;
  local_38->flags = local_38->flags | 2;
  pp_Var8 = &node->properties;
  pxVar6 = node;
  local_3c = parentType;
  while (p_Var1 = *pp_Var8, p_Var1 != (_xmlAttr *)0x0) {
    if (p_Var1->ns == (xmlNs *)0x0) {
      iVar3 = xmlStrEqual(p_Var1->name,"id");
      pxVar6 = extraout_RDX_01;
      if ((iVar3 == 0) &&
         (iVar3 = xmlStrEqual(p_Var1->name,"base"), pxVar6 = extraout_RDX_02, iVar3 == 0))
      goto LAB_001924ec;
    }
    else {
      iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar6 = extraout_RDX;
      if (iVar3 != 0) {
LAB_001924ec:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,(xmlSchemaBasicItemPtr)pxVar6,attr);
        pxVar6 = extraout_RDX_00;
      }
    }
    pp_Var8 = &p_Var1->next;
  }
  xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar6);
  pxVar5 = local_38;
  name = &local_38->baseNs;
  uri = &local_38->base;
  pxVar6 = (xmlNodePtr)0x1d4e7e;
  message = uri;
  iVar3 = xmlSchemaPValAttrQName
                    (ctxt,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)0x1d4e7e,(char *)name,uri,
                     in_stack_ffffffffffffffa8);
  pxVar4 = (xmlSchemaTypePtr)CONCAT44(extraout_var,iVar3);
  if ((iVar3 == 0) && (*uri == (xmlChar *)0x0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1d4e7e,pxVar6,(char *)name,
               (char *)message);
    pxVar4 = extraout_RAX;
  }
  pxVar6 = node->children;
  if (pxVar6 == (xmlNodePtr)0x0) {
    return pxVar4;
  }
  local_48 = pxVar6;
  if (pxVar6->ns != (xmlNs *)0x0) {
    iVar3 = xmlStrEqual(pxVar6->name,(xmlChar *)"annotation");
    pxVar4 = (xmlSchemaTypePtr)CONCAT44(extraout_var_00,iVar3);
    if (iVar3 != 0) {
      iVar3 = xmlStrEqual(pxVar6->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar4 = (xmlSchemaTypePtr)CONCAT44(extraout_var_01,iVar3);
      if (iVar3 != 0) {
        annot = xmlSchemaParseAnnotation(ctxt,pxVar6,1);
        pxVar4 = (xmlSchemaTypePtr)xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar5,annot);
        pxVar6 = pxVar6->next;
        local_48 = pxVar6;
      }
    }
  }
  bVar9 = local_3c == XML_SCHEMA_TYPE_COMPLEX_CONTENT;
  if (bVar9) {
    if (pxVar6 == (xmlNodePtr)0x0) {
      return pxVar4;
    }
    bVar2 = true;
    if (pxVar6->ns == (xmlNs *)0x0) goto LAB_001926d8;
    iVar3 = xmlStrEqual(pxVar6->name,"all");
    pxVar7 = pxVar6->ns;
    if (iVar3 == 0) {
LAB_00192632:
      if (pxVar7 == (xmlNs *)0x0) goto LAB_001926d8;
      iVar3 = xmlStrEqual(pxVar6->name,(xmlChar *)"choice");
      pxVar7 = pxVar6->ns;
      if (iVar3 != 0) {
        iVar3 = xmlStrEqual(pxVar7->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar3 != 0) {
          type = XML_SCHEMA_TYPE_CHOICE;
          goto LAB_001926aa;
        }
        pxVar7 = pxVar6->ns;
      }
      if (pxVar7 == (xmlNs *)0x0) goto LAB_001926d8;
      iVar3 = xmlStrEqual(pxVar6->name,(xmlChar *)"sequence");
      pxVar7 = pxVar6->ns;
      if (iVar3 != 0) {
        iVar3 = xmlStrEqual(pxVar7->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar3 != 0) {
          type = XML_SCHEMA_TYPE_SEQUENCE;
          goto LAB_001926aa;
        }
        pxVar7 = pxVar6->ns;
      }
      if (((pxVar7 == (xmlNs *)0x0) || (iVar3 = xmlStrEqual(pxVar6->name,"group"), iVar3 == 0)) ||
         (iVar3 = xmlStrEqual(pxVar6->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar3 == 0)) goto LAB_001926d8;
      pxVar4 = (xmlSchemaTypePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,pxVar6);
    }
    else {
      iVar3 = xmlStrEqual(pxVar7->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar3 == 0) {
        pxVar7 = pxVar6->ns;
        goto LAB_00192632;
      }
      type = XML_SCHEMA_TYPE_ALL;
LAB_001926aa:
      pxVar4 = (xmlSchemaTypePtr)xmlSchemaParseModelGroup(ctxt,schema,pxVar6,type,1);
    }
    pxVar5->subtypes = pxVar4;
    pxVar6 = pxVar6->next;
    local_48 = pxVar6;
  }
  bVar2 = bVar9;
  if (pxVar6 == (xmlNodePtr)0x0) {
    return pxVar4;
  }
LAB_001926d8:
  iVar3 = xmlSchemaParseLocalAttributes
                    (ctxt,schema,&local_48,(xmlSchemaItemListPtr *)&pxVar5->attrUses,0xd,(int *)0x0)
  ;
  pxVar6 = local_48;
  if ((iVar3 != -1) && (local_48 != (xmlNodePtr)0x0)) {
    if ((local_48->ns != (xmlNs *)0x0) &&
       ((iVar3 = xmlStrEqual(local_48->name,(xmlChar *)"anyAttribute"), iVar3 != 0 &&
        (iVar3 = xmlStrEqual(pxVar6->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
        iVar3 != 0)))) {
      pxVar5 = (xmlSchemaTypePtr)xmlSchemaParseAnyAttribute(ctxt,schema,pxVar6);
      ctxt->ctxtType->attributeWildcard = (xmlSchemaWildcardPtr)pxVar5;
      pxVar6 = pxVar6->next;
      if (pxVar6 == (xmlNodePtr)0x0) {
        return pxVar5;
      }
    }
    if (bVar2) {
      message_00 = 
      "(annotation?, ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?)))"
      ;
    }
    else {
      message_00 = "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))";
    }
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,pxVar6,
               (xmlNodePtr)0x0,message_00,in_stack_00000008);
    return extraout_RAX_00;
  }
  return (xmlSchemaTypePtr)CONCAT44(extraout_var_02,iVar3);
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseExtension(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr node, xmlSchemaTypeType parentType)
{
    xmlSchemaTypePtr type;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /* Not a component, don't create it. */
    type = ctxt->ctxtType;
    type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_EXTENSION;

    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "base"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");

    /*
    * Attribute "base" - mandatory.
    */
    if ((xmlSchemaPValAttrQName(ctxt, schema, NULL, node,
	"base", &(type->baseNs), &(type->base)) == 0) &&
	(type->base == NULL)) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "base", NULL);
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* Add the annotation to the type ancestor.
	*/
	xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr) type,
	    xmlSchemaParseAnnotation(ctxt, child, 1));
        child = child->next;
    }
    if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	/*
	* Corresponds to <complexType><complexContent><extension>... and:
	*
	* Model groups <all>, <choice>, <sequence> and <group>.
	*/
	if (IS_SCHEMA(child, "all")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_ALL, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "choice")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_CHOICE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "sequence")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		child, XML_SCHEMA_TYPE_SEQUENCE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "group")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	/*
	* Attribute uses/declarations.
	*/
	if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_EXTENSION, NULL) == -1)
	    return(NULL);
	/*
	* Attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    ctxt->ctxtType->attributeWildcard =
		xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	    /* Complex content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((group | all | choice | sequence)?, "
		"((attribute | attributeGroup)*, anyAttribute?)))");
	} else {
	    /* Simple content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((attribute | attributeGroup)*, "
		"anyAttribute?))");
	}
    }
    return (NULL);
}